

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O3

int generateCombinatorialStabilExhaust
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  Aig_Obj_t *p1;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < combK + 2U) {
    iVar9 = combK + 3;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  if (iVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar9 << 2);
  }
  p->pArray = piVar4;
  if (-1 < combK) {
    iVar9 = -1;
    do {
      Vec_IntPush(p,iVar9);
      iVar9 = iVar9 + 1;
    } while (combK != iVar9);
  }
  Vec_IntPush(p,combN);
  iVar9 = 0;
  Vec_IntPush(p,0);
  while( true ) {
    p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
    if (0 < combK) {
      iVar1 = p->nSize;
      uVar8 = combK;
      do {
        if (iVar1 <= combK) goto LAB_0059875f;
        uVar3 = (pAigOld->nObjs[2] - pAigOld->nRegs) + p->pArray[uVar8];
        if (((int)uVar3 < 0) || (pAigOld->vCis->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        p1 = Aig_Or(pAigNew,*(Aig_Obj_t **)((long)pAigOld->vCis->pArray[uVar3] + 0x28),p1);
        bVar2 = 1 < (int)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    uVar8 = vDisj_nCk_->nSize;
    if (uVar8 == vDisj_nCk_->nCap) {
      if ((int)uVar8 < 0x10) {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vDisj_nCk_->pArray,0x80);
        }
        vDisj_nCk_->pArray = ppvVar5;
        vDisj_nCk_->nCap = 0x10;
      }
      else {
        if (vDisj_nCk_->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vDisj_nCk_->pArray,(ulong)uVar8 << 4);
        }
        vDisj_nCk_->pArray = ppvVar5;
        vDisj_nCk_->nCap = uVar8 * 2;
      }
    }
    else {
      ppvVar5 = vDisj_nCk_->pArray;
    }
    iVar9 = iVar9 + 1;
    iVar1 = vDisj_nCk_->nSize;
    vDisj_nCk_->nSize = iVar1 + 1;
    ppvVar5[iVar1] = p1;
    lVar6 = (long)p->nSize;
    if ((lVar6 < 2) || (lVar6 == 2)) break;
    piVar4 = p->pArray;
    lVar7 = 0;
    while( true ) {
      if (piVar4[lVar7 + 1] + 1 != piVar4[lVar7 + 2]) break;
      piVar4[lVar7 + 1] = (int)lVar7;
      lVar7 = lVar7 + 1;
      if (lVar6 + -2 == lVar7) goto LAB_0059875f;
    }
    if (combK < (int)lVar7 + 1) {
      free(piVar4);
      free(p);
      return iVar9;
    }
    piVar4[lVar7 + 1] = piVar4[lVar7 + 1] + 1;
  }
LAB_0059875f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int generateCombinatorialStabilExhaust( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			//targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			targetPoIndex = Vec_IntEntry(vC_KNUTH, i_KNUTH);
			pObj = (Aig_Obj_t *)(Aig_ManLo( pAigOld, targetPoIndex )->pData);
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}